

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_referenceExternalSequences(ZSTD_CCtx *cctx,rawSeq *seq,size_t nbSeq)

{
  size_t sVar1;
  
  sVar1 = 0xffffffffffffffc4;
  if ((cctx->stage == ZSTDcs_init) &&
     (sVar1 = 0xffffffffffffffd8, (cctx->appliedParams).ldmParams.enableLdm == 0)) {
    (cctx->externSeqStore).seq = seq;
    (cctx->externSeqStore).size = nbSeq;
    (cctx->externSeqStore).capacity = nbSeq;
    (cctx->externSeqStore).pos = 0;
    return 0;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_referenceExternalSequences(ZSTD_CCtx* cctx, rawSeq* seq, size_t nbSeq)
{
    if (cctx->stage != ZSTDcs_init)
        return ERROR(stage_wrong);
    if (cctx->appliedParams.ldmParams.enableLdm)
        return ERROR(parameter_unsupported);
    cctx->externSeqStore.seq = seq;
    cctx->externSeqStore.size = nbSeq;
    cctx->externSeqStore.capacity = nbSeq;
    cctx->externSeqStore.pos = 0;
    return 0;
}